

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O0

void __thiscall
hwtest::pgraph::MthdCelsiusBlendEquation::emulate_mthd(MthdCelsiusBlendEquation *this)

{
  uint local_18;
  uint local_14;
  uint32_t rv;
  uint32_t err;
  MthdCelsiusBlendEquation *this_local;
  
  pgraph_celsius_pre_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
  local_14 = 0;
  local_18 = 0;
  switch((this->super_SingleMthdTest).super_MthdTest.val) {
  case 0x8006:
    local_18 = 2;
    break;
  case 0x8007:
    local_18 = 3;
    break;
  case 0x8008:
    local_18 = 4;
    break;
  default:
    local_14 = 1;
    break;
  case 0x800a:
    local_18 = 0;
    break;
  case 0x800b:
    local_18 = 1;
  }
  if ((long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_config_c
            << 0x37) < 0) {
    local_14 = local_14 | 4;
  }
  if (local_14 == 0) {
    if (-1 < (long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource
                   << 0x3e)) {
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_blend =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_blend & 0xfffffff8
           | local_18;
      pgraph_celsius_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0x20,
                          (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                          bundle_blend,true);
    }
  }
  else {
    MthdTest::warn((MthdTest *)this,local_14);
  }
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_celsius_pre_icmd(&exp);
		uint32_t err = 0;
		uint32_t rv = 0;
		switch (val) {
			case 0x8006:
				rv = 0x2;
				break;
			case 0x8007:
				rv = 0x3;
				break;
			case 0x8008:
				rv = 0x4;
				break;
			case 0x800a:
				rv = 0x0;
				break;
			case 0x800b:
				rv = 0x1;
				break;
			default:
				err |= 1;
				break;
		}
		if (extr(exp.celsius_config_c, 8, 1))
			err |= 4;
		if (err) {
			warn(err);
		} else {
			if (!extr(exp.nsource, 1, 1)) {
				insrt(exp.bundle_blend, 0, 3, rv);
				pgraph_celsius_icmd(&exp, 0x20, exp.bundle_blend, true);
			}
		}
	}